

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetri.cpp
# Opt level: O1

void add(float *p,float *dest,uint tstride,uint *pcount)

{
  uint uVar1;
  ulong uVar2;
  char *d;
  
  uVar1 = *pcount;
  uVar2 = (ulong)(tstride * uVar1);
  *(float *)((long)dest + uVar2) = *p;
  *(float *)((long)dest + uVar2 + 4) = p[1];
  *(float *)((long)dest + uVar2 + 8) = p[2];
  uVar1 = uVar1 + 1;
  *pcount = uVar1;
  if (uVar1 < 5) {
    return;
  }
  __assert_fail("pcount <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/planetri.cpp"
                ,0x49,"void add(const float *, float *, unsigned int, unsigned int &)");
}

Assistant:

static void add(const float *p,float *dest,unsigned int tstride,unsigned int &pcount)
{
  char *d = (char *) dest;
  d = d + pcount*tstride;
  dest = (float *) d;
  dest[0] = p[0];
  dest[1] = p[1];
  dest[2] = p[2];
  pcount++;
	assert( pcount <= 4 );
}